

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::CheckMultipleOutputs
          (cmLocalUnixMakefileGenerator3 *this,bool verbose)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue value;
  string *filename;
  string *psVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmList pairs;
  string local_e0;
  string local_c0;
  pointer local_a0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  cmList local_48;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"CMAKE_MULTIPLE_OUTPUT_PAIRS","");
  value = cmMakefile::GetDefinition(this_00,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (value.Value != (string *)0x0) {
    cmList::cmList(&local_48,value.Value,Yes,Yes);
    if (local_48.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filename = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      do {
        if (filename ==
            local_48.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        bVar1 = cmsys::SystemTools::FileExists(filename);
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileExists(filename + -1);
          if (!bVar1) {
            if (verbose) {
              local_c0._M_dataplus._M_p = &DAT_00000028;
              local_c0._M_string_length = 0x983845;
              local_c0.field_2._M_allocated_capacity = 0;
              local_a0 = (filename->_M_dataplus)._M_p;
              local_c0.field_2._8_8_ = filename->_M_string_length;
              local_98 = 0;
              local_90 = 0x1a;
              local_88 = "\" because another output \"";
              local_80 = 0;
              local_70 = filename[-1]._M_dataplus._M_p;
              local_78 = filename[-1]._M_string_length;
              local_68 = 0;
              local_60 = 0x12;
              local_58 = "\" does not exist.\n";
              local_50 = 0;
              views._M_len = 5;
              views._M_array = (iterator)&local_c0;
              cmCatViews(&local_e0,views);
              cmSystemTools::Stdout(&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            cmsys::SystemTools::RemoveFile(filename);
          }
        }
        psVar2 = filename + 1;
        filename = filename + 2;
      } while (psVar2 != local_48.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.Values);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CheckMultipleOutputs(bool verbose)
{
  cmMakefile* mf = this->Makefile;

  // Get the string listing the multiple output pairs.
  cmValue pairs_string = mf->GetDefinition("CMAKE_MULTIPLE_OUTPUT_PAIRS");
  if (!pairs_string) {
    return;
  }

  // Convert the string to a list and preserve empty entries.
  cmList pairs{ *pairs_string, cmList::EmptyElements::Yes };
  for (auto i = pairs.begin(); i != pairs.end() && (i + 1) != pairs.end();) {
    const std::string& depender = *i++;
    const std::string& dependee = *i++;

    // If the depender is missing then delete the dependee to make
    // sure both will be regenerated.
    if (cmSystemTools::FileExists(dependee) &&
        !cmSystemTools::FileExists(depender)) {
      if (verbose) {
        cmSystemTools::Stdout(cmStrCat(
          "Deleting primary custom command output \"", dependee,
          "\" because another output \"", depender, "\" does not exist.\n"));
      }
      cmSystemTools::RemoveFile(dependee);
    }
  }
}